

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_2::DeepScanLineOutputFile::setFrameBuffer
          (DeepScanLineOutputFile *this,DeepFrameBuffer *frameBuffer)

{
  _Base_ptr name;
  pthread_mutex_t *__mutex;
  undefined8 uVar1;
  ptrdiff_t pVar2;
  size_t sVar3;
  double dVar4;
  size_t sVar5;
  bool bVar6;
  PixelType PVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  int iVar10;
  ChannelList *this_00;
  const_iterator cVar11;
  ConstIterator CVar12;
  ConstIterator CVar13;
  const_iterator cVar14;
  Slice *pSVar15;
  pointer ppOVar16;
  pointer ppOVar17;
  ostream *poVar18;
  char *pcVar19;
  ArgExc *pAVar20;
  size_t __n;
  pointer __src;
  ulong uVar21;
  DeepFrameBuffer *__n_00;
  Data *pDVar22;
  ulong __n_01;
  vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
  slices;
  value_type local_1c0;
  undefined1 local_1b8 [16];
  pointer local_1a8;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar10 = pthread_mutex_lock(__mutex);
  if (iVar10 != 0) {
    std::__throw_system_error(iVar10);
  }
  this_00 = Header::channels(&this->_data->header);
  for (cVar11._M_node = (_Base_ptr)ChannelList::begin(this_00); CVar12 = ChannelList::end(this_00),
      (const_iterator)cVar11._M_node != CVar12._i._M_node;
      cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar11._M_node)) {
    name = cVar11._M_node + 1;
    CVar13 = DeepFrameBuffer::find(frameBuffer,(char *)name);
    cVar14._M_node = (_Base_ptr)DeepFrameBuffer::end(frameBuffer);
    if (CVar13._i._M_node != (const_iterator)cVar14._M_node) {
      if (cVar11._M_node[9]._M_color != *(_Rb_tree_color *)((long)CVar13._i._M_node + 0x120)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Pixel type of \"",0xf);
        poVar18 = std::operator<<((ostream *)&local_1a8,(char *)name);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"\" channel of output file \"",0x1a);
        pcVar19 = OStream::fileName(this->_data->_streamData->os);
        poVar18 = std::operator<<(poVar18,pcVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"\" is not compatible with the frame buffer\'s pixel type.",0x37);
        pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar20,(stringstream *)local_1b8);
        __cxa_throw(pAVar20,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      if ((*(int *)&cVar11._M_node[9].field_0x4 != *(int *)((long)CVar13._i._M_node + 0x140)) ||
         (*(int *)&cVar11._M_node[9]._M_parent != *(int *)((long)CVar13._i._M_node + 0x144))) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"X and/or y subsampling factors of \"",0x23);
        poVar18 = std::operator<<((ostream *)&local_1a8,(char *)name);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"\" channel of output file \"",0x1a);
        pcVar19 = OStream::fileName(this->_data->_streamData->os);
        poVar18 = std::operator<<(poVar18,pcVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"\" are not compatible with the frame buffer\'s subsampling factors.",
                   0x41);
        pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar20,(stringstream *)local_1b8);
        __cxa_throw(pAVar20,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
    }
  }
  pSVar15 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
  if (pSVar15->base == (char *)0x0) {
    pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar20,"Invalid base pointer, please set a proper sample count slice.")
    ;
    __cxa_throw(pAVar20,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  pDVar22 = this->_data;
  pDVar22->sampleCountSliceBase = pSVar15->base;
  sVar5 = pSVar15->yStride;
  pDVar22->sampleCountXStride = (int)pSVar15->xStride;
  pDVar22->sampleCountYStride = (int)sVar5;
  local_1b8 = (undefined1  [16])0x0;
  local_1a8 = (pointer)0x0;
  cVar11._M_node = (_Base_ptr)ChannelList::begin(this_00);
  for (; CVar12 = ChannelList::end(this_00), (const_iterator)cVar11._M_node != CVar12._i._M_node;
      cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar11._M_node)) {
    CVar13 = DeepFrameBuffer::find(frameBuffer,(char *)(cVar11._M_node + 1));
    cVar14._M_node = (_Base_ptr)DeepFrameBuffer::end(frameBuffer);
    if (CVar13._i._M_node == (const_iterator)cVar14._M_node) {
      local_1c0 = (value_type)operator_new(0x38);
      local_1c0->type = cVar11._M_node[9]._M_color;
      uVar1 = *(undefined8 *)&cVar11._M_node[9].field_0x4;
      local_1c0->xStride = 0;
      local_1c0->yStride = 0;
      local_1c0->base = (char *)0x0;
      local_1c0->sampleStride = 0;
      local_1c0->xSampling = (int)uVar1;
      local_1c0->ySampling = (int)((ulong)uVar1 >> 0x20);
      local_1c0->zero = true;
      std::
      vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
      ::push_back((vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                   *)local_1b8,&local_1c0);
    }
    else {
      local_1c0 = (value_type)operator_new(0x38);
      pcVar19 = *(char **)((long)CVar13._i._M_node + 0x128);
      iVar10 = *(int *)((long)CVar13._i._M_node + 0x154);
      local_1c0->type = *(PixelType *)((long)CVar13._i._M_node + 0x120);
      local_1c0->base = pcVar19;
      local_1c0->sampleStride = (long)iVar10;
      pVar2 = *(ptrdiff_t *)((long)CVar13._i._M_node + 0x138);
      local_1c0->xStride = *(ptrdiff_t *)((long)CVar13._i._M_node + 0x130);
      local_1c0->yStride = pVar2;
      uVar1 = *(undefined8 *)((long)CVar13._i._M_node + 0x140);
      local_1c0->xSampling = (int)uVar1;
      local_1c0->ySampling = (int)((ulong)uVar1 >> 0x20);
      local_1c0->zero = false;
      std::
      vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
      ::push_back((vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                   *)local_1b8,&local_1c0);
    }
  }
  pDVar22 = this->_data;
  __n_00 = frameBuffer;
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::operator=((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&pDVar22->frameBuffer,
              (_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)frameBuffer);
  bVar6 = (frameBuffer->_sampleCounts).yTileCoords;
  (pDVar22->frameBuffer)._sampleCounts.xTileCoords = (frameBuffer->_sampleCounts).xTileCoords;
  (pDVar22->frameBuffer)._sampleCounts.yTileCoords = bVar6;
  PVar7 = (frameBuffer->_sampleCounts).type;
  uVar8 = *(undefined4 *)&(frameBuffer->_sampleCounts).field_0x4;
  pcVar19 = (frameBuffer->_sampleCounts).base;
  sVar5 = (frameBuffer->_sampleCounts).xStride;
  sVar3 = (frameBuffer->_sampleCounts).yStride;
  iVar10 = (frameBuffer->_sampleCounts).ySampling;
  dVar4 = (frameBuffer->_sampleCounts).fillValue;
  (pDVar22->frameBuffer)._sampleCounts.xSampling = (frameBuffer->_sampleCounts).xSampling;
  (pDVar22->frameBuffer)._sampleCounts.ySampling = iVar10;
  (pDVar22->frameBuffer)._sampleCounts.fillValue = dVar4;
  (pDVar22->frameBuffer)._sampleCounts.xStride = sVar5;
  (pDVar22->frameBuffer)._sampleCounts.yStride = sVar3;
  (pDVar22->frameBuffer)._sampleCounts.type = PVar7;
  *(undefined4 *)&(pDVar22->frameBuffer)._sampleCounts.field_0x4 = uVar8;
  (pDVar22->frameBuffer)._sampleCounts.base = pcVar19;
  pDVar22 = this->_data;
  ppOVar16 = (pDVar22->slices).
             super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppOVar17 = (pDVar22->slices).
             super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppOVar17 == ppOVar16) {
    __n = 0;
  }
  else {
    uVar21 = 0;
    do {
      __n_00 = (DeepFrameBuffer *)&DAT_00000038;
      operator_delete(ppOVar16[uVar21],0x38);
      uVar21 = uVar21 + 1;
      pDVar22 = this->_data;
      ppOVar16 = (pDVar22->slices).
                 super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppOVar17 = (pDVar22->slices).
                 super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      __n = (long)ppOVar17 - (long)ppOVar16;
    } while (uVar21 < (ulong)((long)__n >> 3));
  }
  uVar1 = local_1b8._0_8_;
  uVar9 = local_1b8._8_8_;
  uVar21 = local_1b8._8_8_ - local_1b8._0_8_;
  if ((ulong)((long)(pDVar22->slices).
                    super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppOVar16) < uVar21) {
    ppOVar16 = std::
               _Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
               ::_M_allocate((_Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                              *)((long)uVar21 >> 3),(size_t)__n_00);
    if (uVar9 != uVar1) {
      memcpy(ppOVar16,(void *)uVar1,uVar21);
    }
    ppOVar17 = (pDVar22->slices).
               super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppOVar17 != (pointer)0x0) {
      operator_delete(ppOVar17,(long)(pDVar22->slices).
                                     super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ppOVar17);
    }
    (pDVar22->slices).
    super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppOVar16;
    (pDVar22->slices).
    super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)ppOVar16 + uVar21);
  }
  else {
    if (__n < uVar21) {
      if (ppOVar17 != ppOVar16) {
        memmove(ppOVar16,(void *)local_1b8._0_8_,__n);
        ppOVar17 = (pDVar22->slices).
                   super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        __n = (long)ppOVar17 -
              (long)(pDVar22->slices).
                    super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      }
      __src = (pointer)(__n + uVar1);
      __n_01 = uVar9 - (long)__src;
      if (__n_01 == 0) goto LAB_00165e79;
    }
    else {
      __n_01 = uVar21;
      __src = (pointer)local_1b8._0_8_;
      ppOVar17 = ppOVar16;
      if (local_1b8._8_8_ == local_1b8._0_8_) goto LAB_00165e79;
    }
    memmove(ppOVar17,__src,__n_01);
  }
LAB_00165e79:
  (pDVar22->slices).
  super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(uVar21 + (long)(pDVar22->slices).
                                super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)local_1a8 - uVar1);
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
DeepScanLineOutputFile::setFrameBuffer (const DeepFrameBuffer& frameBuffer)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    //
    // Check if the new frame buffer descriptor
    // is compatible with the image file header.
    //

    const ChannelList& channels = _data->header.channels ();

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        DeepFrameBuffer::ConstIterator j = frameBuffer.find (i.name ());

        if (j == frameBuffer.end ()) continue;

        if (i.channel ().type != j.slice ().type)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Pixel type of \"" << i.name ()
                                   << "\" channel "
                                      "of output file \""
                                   << fileName ()
                                   << "\" is "
                                      "not compatible with the frame buffer's "
                                      "pixel type.");
        }

        if (i.channel ().xSampling != j.slice ().xSampling ||
            i.channel ().ySampling != j.slice ().ySampling)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "X and/or y subsampling factors "
                "of \""
                    << i.name ()
                    << "\" channel "
                       "of output file \""
                    << fileName ()
                    << "\" are "
                       "not compatible with the frame buffer's "
                       "subsampling factors.");
        }
    }

    //
    // Store the pixel sample count table.
    // (TODO) Support for different sampling rates?
    //

    const Slice& sampleCountSlice = frameBuffer.getSampleCountSlice ();
    if (sampleCountSlice.base == 0)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Invalid base pointer, please set a proper sample count slice.");
    }
    else
    {
        _data->sampleCountSliceBase = sampleCountSlice.base;
        _data->sampleCountXStride = static_cast<int> (sampleCountSlice.xStride);
        _data->sampleCountYStride = static_cast<int> (sampleCountSlice.yStride);
    }

    //
    // Initialize slice table for writePixels().
    // Pixel sample count slice is not presented in the header,
    // so it wouldn't be added here.
    // Store the pixel base pointer table.
    // (TODO) Support for different sampling rates?
    //

    vector<OutSliceInfo*> slices;

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        DeepFrameBuffer::ConstIterator j = frameBuffer.find (i.name ());

        if (j == frameBuffer.end ())
        {
            //
            // Channel i is not present in the frame buffer.
            // In the file, channel i will contain only zeroes.
            //

            slices.push_back (new OutSliceInfo (
                i.channel ().type,
                NULL, // base
                0,    // sampleStride,
                0,    // xStride
                0,    // yStride
                i.channel ().xSampling,
                i.channel ().ySampling,
                true)); // zero
        }
        else
        {
            //
            // Channel i is present in the frame buffer.
            //

            slices.push_back (new OutSliceInfo (
                j.slice ().type,
                j.slice ().base,
                j.slice ().sampleStride,
                j.slice ().xStride,
                j.slice ().yStride,
                j.slice ().xSampling,
                j.slice ().ySampling,
                false)); // zero
        }
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;

    for (size_t i = 0; i < _data->slices.size (); i++)
        delete _data->slices[i];
    _data->slices = slices;
}